

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

bool __thiscall
UdpSocketImpl::Create(UdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szIpToBind)

{
  int32_t *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  undefined6 in_register_00000012;
  uint __val;
  uint uVar5;
  addrinfo *lstBind;
  addrinfo *lstAddr;
  uint32_t on;
  thread local_a8;
  addrinfo *local_a0;
  code *local_98;
  undefined8 local_90;
  long local_88 [2];
  char *local_78;
  UdpSocketImpl *local_70;
  addrinfo local_68;
  
  local_a0 = (addrinfo *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 2;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 1;
  local_68.ai_family = 0;
  uVar5 = 1;
  if (((9 < sPort) && (uVar5 = 2, 99 < sPort)) && (uVar5 = 3, 999 < sPort)) {
    uVar5 = 5 - (sPort < 10000);
  }
  local_98 = (code *)local_88;
  local_78 = szIpToBind;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar5);
  __val = (uint)CONCAT62(in_register_00000012,sPort);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,uVar5,__val);
  iVar2 = getaddrinfo(szIpToWhere,(char *)local_98,&local_68,&local_a0);
  if (local_98 != (code *)local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (iVar2 != 0) {
    return false;
  }
  iVar2 = socket(local_a0->ai_family,local_a0->ai_socktype,local_a0->ai_protocol);
  piVar1 = &(this->super_BaseSocketImpl).m_fSock;
  (this->super_BaseSocketImpl).m_fSock = iVar2;
  if (iVar2 != -1) {
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(this,piVar1);
    if (local_a0->ai_family == 10) {
      local_98 = (code *)((ulong)local_98 & 0xffffffff00000000);
      iVar2 = setsockopt(*piVar1,0x29,0x1a,&local_98,4);
      if (iVar2 == -1) {
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
    }
    if (local_78 != (char *)0x0) {
      uVar5 = 1;
      if (((9 < sPort) && (uVar5 = 2, 99 < sPort)) && (uVar5 = 3, 999 < sPort)) {
        uVar5 = 5 - (sPort < 10000);
      }
      local_98 = (code *)local_88;
      std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar5);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,uVar5,__val);
      iVar2 = getaddrinfo(local_78,(char *)local_98,(addrinfo *)0x0,(addrinfo **)&local_a8);
      if (local_98 != (code *)local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      if (iVar2 == 0) {
        iVar2 = bind(*piVar1,*(sockaddr **)((long)local_a8._M_id._M_thread + 0x18),
                     *(socklen_t *)((long)local_a8._M_id._M_thread + 0x10));
        freeaddrinfo((addrinfo *)local_a8._M_id._M_thread);
        if (-1 < iVar2) goto LAB_0011b92d;
      }
      piVar3 = (int *)__cxa_allocate_exception(4);
      piVar4 = __errno_location();
      *piVar3 = *piVar4;
      __cxa_throw(piVar3,&int::typeinfo,0);
    }
    iVar2 = bind(*piVar1,local_a0->ai_addr,local_a0->ai_addrlen);
    if (-1 < iVar2) {
LAB_0011b92d:
      local_98 = SelectThread;
      local_90 = 0;
      local_70 = this;
      std::thread::thread<void(UdpSocketImpl::*)(),UdpSocketImpl*,void>
                (&local_a8,(offset_in_UdpSocketImpl_to_subr *)&local_98,&local_70);
      if ((this->super_BaseSocketImpl).m_thListen._M_id._M_thread == 0) {
        (this->super_BaseSocketImpl).m_thListen._M_id._M_thread =
             (native_handle_type)local_a8._M_id._M_thread;
        local_98 = WriteThread;
        local_90 = 0;
        local_70 = this;
        std::thread::thread<void(UdpSocketImpl::*)(),UdpSocketImpl*,void>
                  (&local_a8,(offset_in_UdpSocketImpl_to_subr *)&local_98,&local_70);
        if ((this->super_BaseSocketImpl).m_thWrite._M_id._M_thread == 0) {
          (this->super_BaseSocketImpl).m_thWrite._M_id._M_thread =
               (native_handle_type)local_a8._M_id._M_thread;
          freeaddrinfo(local_a0);
          return true;
        }
      }
      std::terminate();
    }
  }
  piVar3 = (int *)__cxa_allocate_exception(4);
  piVar4 = __errno_location();
  *piVar3 = *piVar4;
  __cxa_throw(piVar3,&int::typeinfo,0);
}

Assistant:

bool UdpSocketImpl::Create(const char* const szIpToWhere, const uint16_t sPort, const char* const szIpToBind/* = nullptr*/)
{
    struct addrinfo* lstAddr{}, hint{};
    hint.ai_family = AF_UNSPEC;
    hint.ai_socktype = SOCK_DGRAM;
    hint.ai_flags = AI_PASSIVE;

    if (::getaddrinfo(szIpToWhere, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        m_fSock = ::socket(lstAddr->ai_family, lstAddr->ai_socktype, lstAddr->ai_protocol);
        if (m_fSock == INVALID_SOCKET)
            throw WSAGetLastError();

        SetSocketOption(m_fSock);

        if (lstAddr->ai_family == AF_INET6)
        {
            constexpr uint32_t on = 0;
            if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                throw WSAGetLastError();
        }

        if (szIpToBind != nullptr)
        {
            struct addrinfo *lstBind;
            if (::getaddrinfo(szIpToBind, to_string(sPort).c_str(), nullptr, &lstBind) != 0)
                throw WSAGetLastError();

            if (::bind(m_fSock, lstBind->ai_addr, static_cast<int>(lstBind->ai_addrlen)) < 0)
            {
                ::freeaddrinfo(lstBind);
                throw WSAGetLastError();
            }
            ::freeaddrinfo(lstBind);
        }
        else
        {
            if (::bind(m_fSock, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen)) < 0)
                throw WSAGetLastError();
        }

        m_thListen = thread(&UdpSocketImpl::SelectThread, this);
        m_thWrite = thread(&UdpSocketImpl::WriteThread, this);
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}